

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O2

parasail_profile_t *
parasail_profile_create_stats_sse_128_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  __m128i *palVar4;
  __m128i *palVar5;
  __m128i *palVar6;
  parasail_profile_t *ppVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  size_t size;
  ulong uVar21;
  long lVar22;
  __m128i_64_t s;
  __m128i_64_t m;
  __m128i_64_t p;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    pcVar9 = "matrix";
  }
  else {
    if (s1 != (char *)0x0) {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
      }
      uVar1 = matrix->size;
      lVar11 = (long)(int)uVar1;
      uVar21 = (long)(_s1Len + 1) / 2;
      iVar3 = (int)uVar21;
      size = iVar3 * lVar11;
      palVar4 = parasail_memalign___m128i(0x10,size);
      if (((palVar4 != (__m128i *)0x0) &&
          (palVar5 = parasail_memalign___m128i(0x10,size), palVar5 != (__m128i *)0x0)) &&
         (palVar6 = parasail_memalign___m128i(0x10,size), palVar6 != (__m128i *)0x0)) {
        ppVar7 = parasail_profile_new(s1,_s1Len,matrix);
        uVar16 = 0;
        if (ppVar7 != (parasail_profile_t *)0x0) {
          uVar21 = uVar21 & 0xffffffff;
          if (iVar3 < 1) {
            uVar21 = uVar16;
          }
          uVar8 = 0;
          if (0 < (int)uVar1) {
            uVar8 = (ulong)uVar1;
          }
          lVar10 = (long)_s1Len;
          lVar14 = 0;
          do {
            if (uVar16 == uVar8) {
              (ppVar7->profile64).score = palVar4;
              (ppVar7->profile64).matches = palVar5;
              (ppVar7->profile64).similar = palVar6;
              ppVar7->free = parasail_free___m128i;
              return ppVar7;
            }
            lVar14 = (long)(int)lVar14;
            lVar18 = 0;
            for (uVar20 = 0; uVar20 != uVar21; uVar20 = uVar20 + 1) {
              iVar2 = matrix->type;
              lVar17 = lVar18;
              uVar19 = uVar20;
              for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
                if (iVar2 == 0) {
                  if ((long)uVar19 < lVar10) {
                    piVar12 = matrix->matrix +
                              uVar16 * lVar11 + (long)matrix->mapper[(byte)s1[uVar19]];
                    goto LAB_0054c218;
                  }
LAB_0054c21d:
                  lVar13 = 0;
                }
                else {
                  if (lVar10 <= (long)uVar19) goto LAB_0054c21d;
                  piVar12 = (int *)((long)matrix->matrix +
                                   lVar17 + (long)matrix->mapper[(byte)matrix->alphabet[uVar16]] * 4
                                   );
LAB_0054c218:
                  lVar13 = (long)*piVar12;
                }
                *(long *)((long)&p + lVar22 * 8) = lVar13;
                if ((long)uVar19 < lVar10) {
                  uVar15 = (ulong)(uVar16 == (uint)matrix->mapper[(byte)s1[uVar19]]);
                }
                else {
                  uVar15 = 0;
                }
                *(ulong *)((long)&m + lVar22 * 8) = uVar15;
                *(ulong *)((long)&s + lVar22 * 8) = (ulong)(0 < lVar13);
                uVar19 = uVar19 + (long)iVar3;
                lVar17 = lVar17 + size * 4;
              }
              palVar4[lVar14][0] = p.m[0];
              palVar4[lVar14][1] = p.m[1];
              palVar5[lVar14][0] = m.m[0];
              palVar5[lVar14][1] = m.m[1];
              palVar6[lVar14][0] = s.m[0];
              palVar6[lVar14][1] = s.m[1];
              lVar14 = lVar14 + 1;
              lVar18 = lVar18 + lVar11 * 4;
            }
            uVar16 = uVar16 + 1;
          } while( true );
        }
      }
      return (parasail_profile_t *)0x0;
    }
    pcVar9 = "s1";
  }
  fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_stats_sse_128_64",pcVar9);
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_sse_128_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 2; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_64_t p;
            __m128i_64_t m;
            __m128i_64_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], p.m);
            _mm_store_si128(&vProfileM[index], m.m);
            _mm_store_si128(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->profile64.matches = vProfileM;
    profile->profile64.similar = vProfileS;
    profile->free = &parasail_free___m128i;
    return profile;
}